

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool ON_Mesh_Private_AddPerVertexMappingChannels
               (function<ON_TextureMapping_(const_ON_MappingChannel_*)> *get_texture_mapping_func,
               ON_MappingRef *mapping_ref,ON_SimpleArray<ON_TextureMapping::TYPE> *mappings_to_cache
               ,ON_Material *material,
               unordered_map<unsigned_int,_ON_TextureMapping,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ON_TextureMapping>_>_>
               *mappings)

{
  ON_Texture *pOVar1;
  bool bVar2;
  int iVar3;
  iterator iVar4;
  ON_MappingChannel *pOVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  uint mapping_channel_id;
  undefined1 local_90 [32];
  function<ON_TextureMapping_(const_ON_MappingChannel_*)> local_70;
  _Any_data local_50;
  code *local_40;
  
  iVar3 = (material->m_textures).super_ON_ClassArray<ON_Texture>.m_count;
  local_90._16_8_ = get_texture_mapping_func;
  local_90._24_8_ = mappings_to_cache;
  if (0 < iVar3) {
    lVar6 = 0xe0;
    lVar7 = 0;
    do {
      pOVar1 = (material->m_textures).super_ON_ClassArray<ON_Texture>.m_a;
      if (*(char *)((long)&((ON_Texture *)
                           (&((ON_Texture *)
                             (&((ON_Texture *)(&pOVar1->m_texture_id + -1))->m_texture_id + -1))->
                             m_texture_id + -1))->m_texture_id + lVar6 + 0xfffffffffffffff0U) ==
          '\x01') {
        local_90._0_4_ = *(key_type_conflict *)((long)pOVar1 + lVar6 + -0xc0);
        iVar4 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_ON_TextureMapping>,_std::allocator<std::pair<const_unsigned_int,_ON_TextureMapping>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&mappings->_M_h,(key_type_conflict *)local_90);
        if (iVar4.super__Node_iterator_base<std::pair<const_unsigned_int,_ON_TextureMapping>,_false>
            ._M_cur == (__node_type *)0x0) {
          if (mapping_ref == (ON_MappingRef *)0x0) {
            pOVar5 = (ON_MappingChannel *)0x0;
          }
          else {
            pOVar5 = ON_MappingRef::MappingChannel(mapping_ref,local_90._0_4_);
            if (pOVar5 == (ON_MappingChannel *)0x0) {
              pOVar5 = ON_MappingRef::MappingChannel(mapping_ref,1);
            }
          }
          std::function<ON_TextureMapping_(const_ON_MappingChannel_*)>::function
                    ((function<ON_TextureMapping_(const_ON_MappingChannel_*)> *)&local_50,
                     (function<ON_TextureMapping_(const_ON_MappingChannel_*)> *)local_90._16_8_);
          ON_Mesh_Private_CacheMappingChannel
                    ((function<ON_TextureMapping_(const_ON_MappingChannel_*)> *)&local_50,pOVar5,
                     (ON_SimpleArray<ON_TextureMapping::TYPE> *)local_90._24_8_,local_90._0_4_,
                     mappings);
          if (local_40 != (code *)0x0) {
            (*local_40)(&local_50,&local_50,__destroy_functor);
          }
        }
        iVar3 = (material->m_textures).super_ON_ClassArray<ON_Texture>.m_count;
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x200;
    } while (lVar7 < iVar3);
  }
  if ((mappings->_M_h)._M_element_count == 0) {
    bVar2 = ON_Material::IsPhysicallyBased(material);
    if (bVar2) {
      ON_Material::PhysicallyBased((ON_Material *)local_90);
      dVar8 = (double)(**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 0xb8))();
      if ((ON_UserData *)local_90._8_8_ != (ON_UserData *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
      }
      if (0.0 < dVar8) {
        if (mapping_ref == (ON_MappingRef *)0x0) {
          pOVar5 = (ON_MappingChannel *)0x0;
        }
        else {
          pOVar5 = ON_MappingRef::MappingChannel(mapping_ref,1);
        }
        std::function<ON_TextureMapping_(const_ON_MappingChannel_*)>::function
                  ((function<ON_TextureMapping_(const_ON_MappingChannel_*)> *)(local_90 + 0x20),
                   (function<ON_TextureMapping_(const_ON_MappingChannel_*)> *)local_90._16_8_);
        ON_Mesh_Private_CacheMappingChannel
                  ((function<ON_TextureMapping_(const_ON_MappingChannel_*)> *)(local_90 + 0x20),
                   pOVar5,(ON_SimpleArray<ON_TextureMapping::TYPE> *)local_90._24_8_,1,mappings);
        if (local_70.super__Function_base._M_manager != (code *)0x0) {
          (*local_70.super__Function_base._M_manager)
                    ((_Any_data *)(local_90 + 0x20),(_Any_data *)(local_90 + 0x20),__destroy_functor
                    );
        }
      }
    }
  }
  return true;
}

Assistant:

ON_DECL bool ON_Mesh_Private_AddPerVertexMappingChannels(std::function<ON_TextureMapping(const ON_MappingChannel*)> get_texture_mapping_func, const ON_MappingRef* mapping_ref, const ON_SimpleArray<ON_TextureMapping::TYPE>& mappings_to_cache, const ON_Material& material, std::unordered_map<unsigned int, ON_TextureMapping>& mappings)
{
  for (int i = 0; i < material.m_textures.Count(); i++)
  {
    if (material.m_textures[i].m_bOn)
    {
      // Get mapping channel id and check if mapping already is in the map
      const unsigned int mapping_channel_id = material.m_textures[i].m_mapping_channel_id;
      if (mappings.find(mapping_channel_id) == mappings.end())
      {
        const ON_MappingChannel* mapping_channel = nullptr;
        if (mapping_ref)
        {
          // Get texture mapping and add it to the map
          mapping_channel = mapping_ref->MappingChannel(mapping_channel_id);
          if (mapping_channel == nullptr)
          {
            // If a mapping channel is not found using 'mapping_channel_id', then try with a mapping channel id of 1.
            // This is done according to the documentation for ON_Texture::m_mapping_channel_id.
            mapping_channel = mapping_ref->MappingChannel(1);
          }
        }

        if (!ON_Mesh_Private_CacheMappingChannel(get_texture_mapping_func, mapping_channel, mappings_to_cache, mapping_channel_id, mappings))
          return false;
      }
    }
  }

  // If we didn't cache any texture coordinates above, but we have a material with anisotropy,
  // which requires tangents, which in turn requires texture coordinates, then we cache
  // the texture coordinates from mapping channel 1.
  if (mappings.size() == 0)
  {
    if (material.IsPhysicallyBased() && material.PhysicallyBased()->Anisotropic() > 0.0)
    {
      const ON_MappingChannel* mapping_channel = mapping_ref ? mapping_ref->MappingChannel(1) : nullptr;

      if (!ON_Mesh_Private_CacheMappingChannel(get_texture_mapping_func, mapping_channel, mappings_to_cache, 1, mappings))
        return false;
    }
  }

  return true;
}